

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.h
# Opt level: O2

bool __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>::MapToNeighSide<double>
          (TPZGeoBlend<pzgeom::TPZGeoTriangle> *this,int side,int SideDim,
          TPZVec<double> *InternalPar,TPZVec<double> *NeighPar,TPZFMatrix<double> *JacNeighSide)

{
  bool bVar1;
  TPZManVector<double,_3> SidePar;
  TPZFNMatrix<9,_double> JacSide;
  TPZTransform<double> tr;
  int local_2ec;
  TPZManVector<double,_3> local_2e8;
  TPZFNMatrix<9,_double> local_2b0;
  TPZTransform<double> local_1d0;
  
  local_2ec = side;
  TPZFNMatrix<9,_double>::TPZFNMatrix(&local_2b0);
  TPZManVector<double,_3>::TPZManVector(&local_2e8,(long)SideDim);
  bVar1 = pztopology::TPZTriangle::CheckProjectionForSingularity<double>(&local_2ec,InternalPar);
  pztopology::TPZTriangle::MapToSide<double>
            (local_2ec,InternalPar,&local_2e8.super_TPZVec<double>,
             &local_2b0.super_TPZFMatrix<double>);
  if (bVar1) {
    (*NeighPar->_vptr_TPZVec[3])(NeighPar,(long)SideDim);
    TPZTransform<double>::TPZTransform(&local_1d0);
    TransfBetweenNeigh<double>(this,local_2ec,&local_1d0);
    TPZTransform<double>::Apply(&local_1d0,&local_2e8.super_TPZVec<double>,NeighPar);
    (*(JacNeighSide->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0xd])(JacNeighSide,0,0);
    TransfBetweenNeigh<double>(this,local_2ec,&local_1d0);
    (*(JacNeighSide->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0xd])(JacNeighSide,
             local_1d0.fMult.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
             fRow,local_2b0.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                  fCol);
    (*local_1d0.fMult.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
      super_TPZSavable._vptr_TPZSavable[0x25])(&local_1d0.fMult,&local_2b0,JacNeighSide,0);
    TPZTransform<double>::~TPZTransform(&local_1d0);
  }
  TPZManVector<double,_3>::~TPZManVector(&local_2e8);
  TPZFNMatrix<9,_double>::~TPZFNMatrix(&local_2b0);
  return bVar1;
}

Assistant:

inline bool
    pzgeom::TPZGeoBlend<TGeo>::MapToNeighSide(int side, int SideDim, TPZVec<T> &InternalPar, TPZVec<T> &NeighPar,
                                              TPZFMatrix<T> &JacNeighSide) const {
        TPZFNMatrix<9, T> JacSide;

        TPZManVector<T, 3> SidePar(SideDim);
        const bool check = TGeo::CheckProjectionForSingularity(side, InternalPar);

        this->MapToSide(side, InternalPar, SidePar, JacSide);
        if (!check) {
            #ifdef PZ_LOG2
            td::stringstream sout;
            sout << "side " << side << std::endl;
            sout << "InternalPar: ";
            for(int i = 0; i < InternalPar.NElements(); i++) sout << InternalPar[i] << "\t";
            sout << "\n";
            sout << "\tmapping is not regular"<<std::endl;
            LOGPZ_DEBUG(logger,sout.str())
            #endif
            return false;
        }
#ifdef PZ_LOG2
        if(logger.isDebugEnabled())
        {
            std::stringstream sout;
            sout << "side " << side << std::endl;
            sout << "InternalPar: ";
            for(int i = 0; i < InternalPar.NElements(); i++) sout << InternalPar[i] << "\t";
            sout << "\n";

            sout << "SidePar: ";
            for(int i = 0; i < SidePar.NElements(); i++) sout << SidePar[i] << "\t";
            sout << "\n";

            JacSide.Print("JacSide = ",sout);
            LOGPZ_DEBUG(logger,sout.str())
        }
#endif

        NeighPar.Resize(SideDim);
        TPZTransform<T> tr;
        TransfBetweenNeigh(side, tr);
        tr.Apply(SidePar, NeighPar);

        JacNeighSide.Resize(0, 0);
        TransfBetweenNeigh(side, tr);
        JacNeighSide.Resize(tr.Mult().Rows(), JacSide.Cols());
        tr.Mult().Multiply(JacSide, JacNeighSide);

#ifdef PZ_LOG2
        if(logger.isDebugEnabled())
        {
            std::stringstream sout;
            
            sout << "NeighPar: ";
            for(int i = 0; i < NeighPar.NElements(); i++) sout << NeighPar[i] << "\t";
            sout << "\n";
            
            JacNeighSide.Print("JacNeighSide = ",sout);
            LOGPZ_DEBUG(logger,sout.str())
        }
#endif

        return true;
    }